

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::SetDragDropPayload(char *type,void *data,size_t data_size,ImGuiCond cond)

{
  int iVar1;
  ImGuiContext *pIVar2;
  size_t sVar3;
  uchar *__dest;
  
  pIVar2 = GImGui;
  if (type == (char *)0x0) {
    __assert_fail("type != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x33c0,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  sVar3 = strlen(type);
  if (0x20 < sVar3) {
    __assert_fail("strlen(type) < ((int)(sizeof(payload.DataType)/sizeof(*payload.DataType))) && \"Payload type can be at most 12 characters long\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x33c1,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if ((data == (void *)0x0 || data_size == 0) && ((data != (void *)0x0 || (data_size != 0)))) {
    __assert_fail("(data != __null && data_size > 0) || (data == __null && data_size == 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x33c2,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if (2 < (uint)cond) {
    __assert_fail("cond == ImGuiCond_Always || cond == ImGuiCond_Once",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x33c3,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if ((pIVar2->DragDropPayload).SourceId == 0) {
    __assert_fail("payload.SourceId != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x33c4,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if ((1 < (uint)cond) && ((pIVar2->DragDropPayload).DataFrameCount != -1)) goto LAB_00186c2f;
  ImStrncpy((pIVar2->DragDropPayload).DataType,type,0x21);
  ImVector<unsigned_char>::resize(&pIVar2->DragDropPayloadBufHeap,0);
  if (data_size < 9) {
    if (data_size != 0) {
      __dest = pIVar2->DragDropPayloadBufLocal;
      pIVar2->DragDropPayloadBufLocal[0] = '\0';
      pIVar2->DragDropPayloadBufLocal[1] = '\0';
      pIVar2->DragDropPayloadBufLocal[2] = '\0';
      pIVar2->DragDropPayloadBufLocal[3] = '\0';
      pIVar2->DragDropPayloadBufLocal[4] = '\0';
      pIVar2->DragDropPayloadBufLocal[5] = '\0';
      pIVar2->DragDropPayloadBufLocal[6] = '\0';
      pIVar2->DragDropPayloadBufLocal[7] = '\0';
      goto LAB_00186c14;
    }
    (pIVar2->DragDropPayload).Data = (void *)0x0;
  }
  else {
    ImVector<unsigned_char>::resize(&pIVar2->DragDropPayloadBufHeap,(int)data_size);
    __dest = (pIVar2->DragDropPayloadBufHeap).Data;
LAB_00186c14:
    (pIVar2->DragDropPayload).Data = __dest;
    memcpy(__dest,data,data_size);
  }
  (pIVar2->DragDropPayload).DataSize = (int)data_size;
LAB_00186c2f:
  iVar1 = pIVar2->FrameCount;
  (pIVar2->DragDropPayload).DataFrameCount = iVar1;
  return pIVar2->DragDropAcceptFrameCount == iVar1 + -1 || pIVar2->DragDropAcceptFrameCount == iVar1
  ;
}

Assistant:

bool ImGui::SetDragDropPayload(const char* type, const void* data, size_t data_size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    if (cond == 0)
        cond = ImGuiCond_Always;

    IM_ASSERT(type != NULL);
    IM_ASSERT(strlen(type) < IM_ARRAYSIZE(payload.DataType) && "Payload type can be at most 12 characters long");
    IM_ASSERT((data != NULL && data_size > 0) || (data == NULL && data_size == 0));
    IM_ASSERT(cond == ImGuiCond_Always || cond == ImGuiCond_Once);
    IM_ASSERT(payload.SourceId != 0);                               // Not called between BeginDragDropSource() and EndDragDropSource()

    if (cond == ImGuiCond_Always || payload.DataFrameCount == -1)
    {
        // Copy payload
        ImStrncpy(payload.DataType, type, IM_ARRAYSIZE(payload.DataType));
        g.DragDropPayloadBufHeap.resize(0);
        if (data_size > sizeof(g.DragDropPayloadBufLocal))
        {
            // Store in heap
            g.DragDropPayloadBufHeap.resize((int)data_size);
            payload.Data = g.DragDropPayloadBufHeap.Data;
            memcpy(payload.Data, data, data_size);
        }
        else if (data_size > 0)
        {
            // Store locally
            memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
            payload.Data = g.DragDropPayloadBufLocal;
            memcpy(payload.Data, data, data_size);
        }
        else
        {
            payload.Data = NULL;
        }
        payload.DataSize = (int)data_size;
    }
    payload.DataFrameCount = g.FrameCount;

    return (g.DragDropAcceptFrameCount == g.FrameCount) || (g.DragDropAcceptFrameCount == g.FrameCount - 1);
}